

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Light_SampleRes * embree::Lights_sample(Light *self,DifferentialGeometry *dg,Vec2f *s)

{
  Vec2f *in_RCX;
  DifferentialGeometry *in_RDX;
  Light *in_RSI;
  Light_SampleRes *in_RDI;
  float fVar1;
  TutorialLightType ty;
  Light_SampleRes *res;
  DifferentialGeometry *in_stack_00000068;
  Light *in_stack_00000070;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  DifferentialGeometry *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Vec2f *in_stack_ffffffffffffffb0;
  DifferentialGeometry *in_stack_ffffffffffffffb8;
  Vec2f *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  switch(in_RSI->type) {
  case LIGHT_AMBIENT:
    AmbientLight_sample((Light *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98,
                        (Vec2f *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    break;
  case LIGHT_POINT:
    PointLight_sample(in_stack_00000070,in_stack_00000068,(Vec2f *)res);
    break;
  case LIGHT_DIRECTIONAL:
    DirectionalLight_sample(in_RSI,in_RDX,in_RCX);
    break;
  case LIGHT_SPOT:
    SpotLight_sample((Light *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (DifferentialGeometry *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_stack_ffffffffffffffc0);
    break;
  default:
    Light_SampleRes::Light_SampleRes(in_RDI);
    *(undefined8 *)&(in_RDI->weight).field_0 = 0;
    *(undefined8 *)((long)&(in_RDI->weight).field_0 + 8) = 0;
    *(undefined8 *)&(in_RDI->dir).field_0 = 0;
    *(undefined8 *)((long)&(in_RDI->dir).field_0 + 8) = 0;
    in_RDI->dist = 0.0;
    fVar1 = std::numeric_limits<float>::infinity();
    in_RDI->pdf = fVar1;
    break;
  case LIGHT_QUAD:
    QuadLight_sample((Light *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb0);
  }
  return in_RDI;
}

Assistant:

Light_SampleRes Lights_sample(const Light* self,
                              const DifferentialGeometry& dg, /*! point to generate the sample for >*/
                              const Vec2f s)                /*! random numbers to generate the sample >*/
{
  TutorialLightType ty = self->type;
  switch (ty) {
  case LIGHT_AMBIENT    : return AmbientLight_sample(self,dg,s);
  case LIGHT_POINT      : return PointLight_sample(self,dg,s);
  case LIGHT_DIRECTIONAL: return DirectionalLight_sample(self,dg,s);
  case LIGHT_SPOT       : return SpotLight_sample(self,dg,s);
  case LIGHT_QUAD       : return QuadLight_sample(self,dg,s);
  default: {
    Light_SampleRes res;
    res.weight = Vec3fa(0,0,0);
    res.dir = Vec3fa(0,0,0);
    res.dist = 0;
    res.pdf = inf;
    return res;
  }
  }
}